

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INeuron.cpp
# Opt level: O2

void __thiscall INeuron::~INeuron(INeuron *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

INeuron::~INeuron()
{
    while ( !inputSynapses.empty()) {
        delete *inputSynapses.begin();
    }
    while ( !outputSynapses.empty()) {
        delete *outputSynapses.begin();
    }
}